

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_q4_1(block_q4_1 *x,float *y,int64_t k)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  int j;
  long lVar8;
  
  uVar5 = 0;
  uVar4 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar4 = uVar5;
  }
  puVar6 = x->qs;
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    uVar7 = (ulong)((uint)uVar5 & 0x7ffffff);
    fVar1 = ggml_table_f32_f16[x[uVar5].field_0.field_0.d];
    fVar2 = ggml_table_f32_f16[x[uVar5].field_0.field_0.m];
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      bVar3 = puVar6[lVar8];
      y[uVar7 * 0x20 + lVar8] = (float)(bVar3 & 0xf) * fVar1 + fVar2;
      y[uVar7 * 0x20 + lVar8 + 0x10] = (float)(bVar3 >> 4) * fVar1 + fVar2;
    }
    puVar6 = puVar6 + 0x14;
  }
  return;
}

Assistant:

void dequantize_row_q4_1(const block_q4_1 * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    static const int qk = QK4_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);
        const float m = GGML_FP16_TO_FP32(x[i].m);

        for (int j = 0; j < qk/2; ++j) {
            const int x0 = (x[i].qs[j] & 0x0F);
            const int x1 = (x[i].qs[j] >>   4);

            y[i*qk + j + 0   ] = x0*d + m;
            y[i*qk + j + qk/2] = x1*d + m;
        }
    }
}